

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,DuplicateRowsPS *old)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003afb68;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar1 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_003b0418;
  this->m_i = old->m_i;
  this->m_i_rowObj = old->m_i_rowObj;
  iVar1 = old->m_minRhsIdx;
  this->m_maxLhsIdx = old->m_maxLhsIdx;
  this->m_minRhsIdx = iVar1;
  bVar2 = old->m_isFirst;
  bVar3 = old->m_isLast;
  bVar4 = old->m_fixed;
  this->m_maxSense = old->m_maxSense;
  this->m_isFirst = bVar2;
  this->m_isLast = bVar3;
  this->m_fixed = bVar4;
  this->m_nCols = old->m_nCols;
  DSVectorBase<double>::DSVectorBase(&this->m_scale,&old->m_scale);
  DSVectorBase<double>::DSVectorBase(&this->m_rowObj,&old->m_rowObj);
  DataArray<int>::DataArray(&this->m_rIdxLocalOld,&old->m_rIdxLocalOld);
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  DataArray<bool>::DataArray(&this->m_isLhsEqualRhs,&old->m_isLhsEqualRhs);
  return;
}

Assistant:

DuplicateRowsPS(const DuplicateRowsPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_i_rowObj(old.m_i_rowObj)
         , m_maxLhsIdx(old.m_maxLhsIdx)
         , m_minRhsIdx(old.m_minRhsIdx)
         , m_maxSense(old.m_maxSense)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_fixed(old.m_fixed)
         , m_nCols(old.m_nCols)
         , m_scale(old.m_scale)
         , m_rowObj(old.m_rowObj)
         , m_rIdxLocalOld(old.m_rIdxLocalOld)
         , m_perm(old.m_perm)
         , m_isLhsEqualRhs(old.m_isLhsEqualRhs)
      {}